

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssllabs.cpp
# Opt level: O0

int __thiscall ssllabs::SSLlabs::curl_read(SSLlabs *this,string *command,string *data)

{
  CURLcode CVar1;
  long lVar2;
  undefined8 uVar3;
  allocator local_51;
  string local_50 [8];
  string url;
  CURL *curl;
  CURLcode code;
  string *data_local;
  string *command_local;
  SSLlabs *this_local;
  
  curl._4_4_ = CURLE_OK;
  lVar2 = curl_easy_init();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"https://api.ssllabs.com/api/v2",&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::__cxx11::string::operator+=(local_50,(string *)command);
  if (lVar2 != 0) {
    CVar1 = curl_easy_setopt(lVar2,0x4e2b,writeCallback);
    verifyCurlStatus(this,CVar1);
    CVar1 = curl_easy_setopt(lVar2,0x2711,data);
    verifyCurlStatus(this,CVar1);
    CVar1 = curl_easy_setopt(lVar2,0x2b,1);
    verifyCurlStatus(this,CVar1);
    CVar1 = curl_easy_setopt(lVar2,0x34,1);
    verifyCurlStatus(this,CVar1);
    CVar1 = curl_easy_setopt(lVar2,0xd,this->timeout);
    verifyCurlStatus(this,CVar1);
    CVar1 = curl_easy_setopt(lVar2,0x2722,"libssllabs/1.0");
    verifyCurlStatus(this,CVar1);
    uVar3 = std::__cxx11::string::c_str();
    CVar1 = curl_easy_setopt(lVar2,0x2712,uVar3);
    verifyCurlStatus(this,CVar1);
    CVar1 = curl_easy_setopt(lVar2,0x20,6);
    verifyCurlStatus(this,CVar1);
    curl._4_4_ = curl_easy_perform(lVar2);
    verifyCurlStatus(this,curl._4_4_);
    curl_easy_cleanup(lVar2);
  }
  std::__cxx11::string::~string(local_50);
  return curl._4_4_;
}

Assistant:

int SSLlabs::curl_read(const std::string &command, const std::string &data) {
        CURLcode code(CURLE_OK);
        CURL *curl = curl_easy_init();
        std::string url(SSLLABS_API_URL);

        url += command;

        if (curl) {
            code = curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, &writeCallback);
            verifyCurlStatus(code);

            code = curl_easy_setopt(curl, CURLOPT_WRITEDATA, (void *) &data);
            verifyCurlStatus(code);

            code = curl_easy_setopt(curl, CURLOPT_NOPROGRESS, 1L);
            verifyCurlStatus(code);

            code = curl_easy_setopt(curl, CURLOPT_FOLLOWLOCATION, 1L);
            verifyCurlStatus(code);

            code = curl_easy_setopt(curl, CURLOPT_TIMEOUT, timeout);
            verifyCurlStatus(code);

            code = curl_easy_setopt(curl, CURLOPT_USERAGENT, SSLLABS_AGENT);
            verifyCurlStatus(code);

            code = curl_easy_setopt(curl, CURLOPT_URL, url.c_str());
            verifyCurlStatus(code);

            code = curl_easy_setopt(curl, CURLOPT_SSLVERSION, CURL_SSLVERSION_TLSv1_2);
            verifyCurlStatus(code);

            code = curl_easy_perform(curl);
            verifyCurlStatus(code);
            
            curl_easy_cleanup(curl);
        }

        return code;
    }